

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

bool isPrime(BigInt *n,int k)

{
  bool bVar1;
  ulong *puVar2;
  reference plVar3;
  longlong lVar4;
  BigInt local_d8;
  BigInt local_b8;
  int local_98;
  int i;
  pair<BigInt,_long_long> local_88;
  undefined1 local_60 [8];
  BigInt d;
  longlong prime;
  iterator __end1;
  iterator __begin1;
  vector<long_long,_std::allocator<long_long>_> *__range1;
  int k_local;
  BigInt *n_local;
  
  bVar1 = BigInt::operator<=(n,&one);
  if (bVar1) {
    n_local._7_1_ = false;
  }
  else {
    bVar1 = BigInt::operator<=(n,&three);
    if (bVar1) {
      n_local._7_1_ = true;
    }
    else {
      puVar2 = (ulong *)std::vector<long_long,_std::allocator<long_long>_>::operator[]
                                  (&n->vector_value,0);
      if ((*puVar2 & 1) == 0) {
        n_local._7_1_ = false;
      }
      else {
        __end1 = std::vector<long_long,_std::allocator<long_long>_>::begin(&primes);
        prime = (longlong)std::vector<long_long,_std::allocator<long_long>_>::end(&primes);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                                           *)&prime), bVar1) {
          plVar3 = __gnu_cxx::
                   __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                   ::operator*(&__end1);
          d._24_8_ = *plVar3;
          lVar4 = BigInt::operator%(n,d._24_8_);
          if (lVar4 == 0) {
            return false;
          }
          __gnu_cxx::
          __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>::
          operator++(&__end1);
        }
        BigInt::operator-((BigInt *)local_60,n,&one);
        while (puVar2 = (ulong *)std::vector<long_long,_std::allocator<long_long>_>::operator[]
                                           ((vector<long_long,_std::allocator<long_long>_> *)
                                            local_60,0), (*puVar2 & 1) == 0) {
          BigInt::Half(&local_88,(BigInt *)local_60);
          BigInt::operator=((BigInt *)local_60,&local_88.first);
          std::pair<BigInt,_long_long>::~pair(&local_88);
        }
        for (local_98 = 0; local_98 < k; local_98 = local_98 + 1) {
          BigInt::BigInt(&local_b8,(BigInt *)local_60);
          BigInt::BigInt(&local_d8,n);
          bVar1 = miillerTest(&local_b8,&local_d8);
          BigInt::~BigInt(&local_d8);
          BigInt::~BigInt(&local_b8);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            n_local._7_1_ = false;
            goto LAB_00104133;
          }
        }
        n_local._7_1_ = true;
LAB_00104133:
        BigInt::~BigInt((BigInt *)local_60);
      }
    }
  }
  return n_local._7_1_;
}

Assistant:

bool isPrime(const BigInt &n, int k = 64) //! false negative probability 2^-128
{
    //! Corner cases
    if (n <= one) return false; //! one or less
    else if (n <= three) return true; //! 2 or 3
    else if (!(n.vector_value[0] & 1)) return false;//! even and not 2

    for (long long prime : primes)
        if (n % prime == 0) //! is prime
            return false;

    //! Find the odd number d such that d*(2^r) + 1 = n  for some r >= 1
    BigInt d = n - one;
    //!Base cases make sure that n must be odd. Since n is odd, n-1 must be even. And an even number can be written as d * 2^s where d is an odd number and s > 0
    while (!(d.vector_value[0] & 1)) //! if we found any odd number it will be put as d
        d = d.Half().first;

    // !Iterate given n repeat of 'k' times
    for (int i = 0; i < k; i++)
        if (!miillerTest(d, n))
            return false;

    return true;
}